

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O0

Float __thiscall pbrt::MitchellFilter::Mitchell1D(MitchellFilter *this,Float x)

{
  long lVar1;
  int in_EDI;
  undefined4 in_register_0000003c;
  float in_XMM0_Da;
  undefined4 local_4;
  
  lVar1 = CONCAT44(in_register_0000003c,in_EDI);
  std::abs(in_EDI);
  if (1.0 < in_XMM0_Da) {
    if (2.0 < in_XMM0_Da) {
      local_4 = 0.0;
    }
    else {
      local_4 = ((-*(float *)(lVar1 + 8) - *(float *)(lVar1 + 0xc) * 6.0) * in_XMM0_Da * in_XMM0_Da
                 * in_XMM0_Da +
                 (*(float *)(lVar1 + 8) * 6.0 + *(float *)(lVar1 + 0xc) * 30.0) * in_XMM0_Da *
                 in_XMM0_Da +
                 (*(float *)(lVar1 + 8) * -12.0 - *(float *)(lVar1 + 0xc) * 48.0) * in_XMM0_Da +
                *(float *)(lVar1 + 8) * 8.0 + *(float *)(lVar1 + 0xc) * 24.0) * 0.16666667;
    }
  }
  else {
    local_4 = (((12.0 - *(float *)(lVar1 + 8) * 9.0) - *(float *)(lVar1 + 0xc) * 6.0) * in_XMM0_Da *
               in_XMM0_Da * in_XMM0_Da +
               (*(float *)(lVar1 + 8) * 12.0 + -18.0 + *(float *)(lVar1 + 0xc) * 6.0) * in_XMM0_Da *
               in_XMM0_Da + (6.0 - *(float *)(lVar1 + 8) * 2.0)) * 0.16666667;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float Mitchell1D(Float x) const {
        x = std::abs(x);
        if (x <= 1)
            return ((12 - 9 * b - 6 * c) * x * x * x + (-18 + 12 * b + 6 * c) * x * x +
                    (6 - 2 * b)) *
                   (1.f / 6.f);
        else if (x <= 2)
            return ((-b - 6 * c) * x * x * x + (6 * b + 30 * c) * x * x +
                    (-12 * b - 48 * c) * x + (8 * b + 24 * c)) *
                   (1.f / 6.f);
        else
            return 0;
    }